

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlValidCtxtPtr xmlNewValidCtxt(void)

{
  xmlValidCtxtPtr ret;
  
  ret = (xmlValidCtxtPtr)(*xmlMalloc)(0x70);
  if (ret == (xmlValidCtxtPtr)0x0) {
    xmlVErrMemory((xmlValidCtxtPtr)0x0,"malloc failed");
    ret = (xmlValidCtxtPtr)0x0;
  }
  else {
    memset(ret,0,0x70);
  }
  return ret;
}

Assistant:

xmlValidCtxtPtr xmlNewValidCtxt(void) {
    xmlValidCtxtPtr ret;

    if ((ret = xmlMalloc(sizeof (xmlValidCtxt))) == NULL) {
	xmlVErrMemory(NULL, "malloc failed");
	return (NULL);
    }

    (void) memset(ret, 0, sizeof (xmlValidCtxt));

    return (ret);
}